

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
 __thiscall
ninx::parser::Parser::parse_sub_expression
          (Parser *this,
          function<std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>_()>
          *term_parser,
          vector<ninx::parser::OperatorCaseDefinition,_std::allocator<ninx::parser::OperatorCaseDefinition>_>
          *operators)

{
  string *psVar1;
  _Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
  _Var2;
  int iVar3;
  undefined8 uVar4;
  undefined8 *in_RCX;
  bool bVar5;
  ulong uVar6;
  string *sequence;
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  second;
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  first;
  long *local_70;
  long *local_68;
  long *local_60;
  long *local_58;
  long *local_50;
  _Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
  local_48;
  undefined8 *local_40;
  long *local_38;
  
  if ((operators->
      super__Vector_base<ninx::parser::OperatorCaseDefinition,_std::allocator<ninx::parser::OperatorCaseDefinition>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
LAB_00149d5a:
    uVar4 = std::__throw_bad_function_call();
    _Unwind_Resume(uVar4);
  }
  local_48.super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl =
       (_Head_base<0UL,_ninx::parser::element::Expression_*,_false>)
       (_Head_base<0UL,_ninx::parser::element::Expression_*,_false>)this;
  local_40 = in_RCX;
  (*(code *)operators[1].
            super__Vector_base<ninx::parser::OperatorCaseDefinition,_std::allocator<ninx::parser::OperatorCaseDefinition>_>
            ._M_impl.super__Vector_impl_data._M_start)(&local_50,operators);
  local_70 = local_50;
  local_50 = (long *)0x0;
  do {
    psVar1 = (string *)local_40[1];
    bVar5 = false;
    for (sequence = (string *)*local_40; sequence != psVar1; sequence = sequence + 2) {
      iVar3 = TokenReader::check_limiter_sequence((TokenReader *)(term_parser + 1),sequence);
      if (iVar3 == 1) {
        if (sequence->_M_string_length != 0) {
          uVar6 = 0;
          do {
            TokenReader::get_token((TokenReader *)(term_parser + 1));
            uVar6 = uVar6 + 1;
          } while (uVar6 < sequence->_M_string_length);
        }
        if ((operators->
            super__Vector_base<ninx::parser::OperatorCaseDefinition,_std::allocator<ninx::parser::OperatorCaseDefinition>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          (*(code *)operators[1].
                    super__Vector_base<ninx::parser::OperatorCaseDefinition,_std::allocator<ninx::parser::OperatorCaseDefinition>_>
                    ._M_impl.super__Vector_impl_data._M_start)(&local_58,operators);
          local_60 = local_70;
          local_68 = local_58;
          local_58 = (long *)0x0;
          if (sequence[1].field_2._M_allocated_capacity != 0) {
            (**(code **)((long)&sequence[1].field_2 + 8))
                      (&local_38,sequence + 1,&local_60,&local_68);
            if (local_68 != (long *)0x0) {
              (**(code **)(*local_68 + 8))();
            }
            local_68 = (long *)0x0;
            if (local_60 != (long *)0x0) {
              (**(code **)(*local_60 + 8))();
            }
            local_60 = (long *)0x0;
            local_70 = local_38;
            if (local_58 != (long *)0x0) {
              (**(code **)(*local_58 + 8))();
            }
            bVar5 = true;
            goto LAB_00149d09;
          }
          std::__throw_bad_function_call();
        }
        std::__throw_bad_function_call();
        goto LAB_00149d5a;
      }
LAB_00149d09:
      if (iVar3 == 1) break;
    }
    _Var2.super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl =
         local_48.super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl;
    if (!bVar5) {
      *(long **)local_48.super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>.
                _M_head_impl = local_70;
      if (local_50 != (long *)0x0) {
        (**(code **)(*local_50 + 8))();
      }
      return (unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
              )(Expression *)
               _Var2.super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl;
    }
  } while( true );
}

Assistant:

std::unique_ptr<Expression>
ninx::parser::Parser::parse_sub_expression(std::function<std::unique_ptr<Expression>()> term_parser,
                                           std::vector<ninx::parser::OperatorCaseDefinition> operators) {
    std::unique_ptr<Expression> expression{nullptr};

    auto first{term_parser()};
    expression = std::move(first);

    while (true) {
        bool found{false};

        for (auto &case_def : operators) {
            if (reader.check_limiter_sequence(case_def.op) == 1) {
                // Remove the tokens
                for (int i = 0; i<case_def.op.length(); i++) {
                    reader.get_token();
                }

                auto second{term_parser()};

                auto sub_expr = case_def.builder(std::move(expression), std::move(second));
                expression = std::move(sub_expr);

                found = true;
                break;
            }
        }

        if (!found) {
            break;
        }
    }

    return std::move(expression);
}